

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

int32 __thiscall rw::Camera::frustumTestSphere(Camera *this,Sphere *s)

{
  int32 iVar1;
  long lVar2;
  float fVar3;
  
  iVar1 = 2;
  lVar2 = 0;
  do {
    fVar3 = (*(float *)((long)&this->frustumPlanes[0].plane.normal.z + lVar2) * (float)(s->center).z
            + *(float *)((long)&this->frustumPlanes[0].plane.normal.x + lVar2) *
              (float)(s->center).x +
              *(float *)((long)&this->frustumPlanes[0].plane.normal.y + lVar2) *
              (float)(s->center).y) -
            *(float *)((long)&this->frustumPlanes[0].plane.distance + lVar2);
    if ((float)s->radius < fVar3) {
      return 0;
    }
    if (-fVar3 < (float)s->radius) {
      iVar1 = 1;
    }
    lVar2 = lVar2 + 0x14;
  } while ((int)lVar2 != 0x78);
  return iVar1;
}

Assistant:

int32
Camera::frustumTestSphere(const Sphere *s) const
{
	int32 res = SPHEREINSIDE;
	const FrustumPlane *p = this->frustumPlanes;
	for(int32 i = 0; i < 6; i++){
		float32 dist = dot(p->plane.normal, s->center) - p->plane.distance;
		if(s->radius < dist)
			return SPHEREOUTSIDE;
		if(s->radius > -dist)
			res = SPHEREBOUNDARY;
		p++;
	}
	return res;
}